

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_tt.c
# Opt level: O3

HPDF_FontDef HPDF_TTFontDef_New(HPDF_MMgr mmgr)

{
  HPDF_FontDef s;
  void *s_00;
  
  if ((mmgr != (HPDF_MMgr)0x0) &&
     (s = (HPDF_FontDef)HPDF_GetMem(mmgr,0x100), s != (HPDF_FontDef)0x0)) {
    HPDF_MemSet(s,'\0',0x100);
    s->sig_bytes = 0x464f4e54;
    s->mmgr = mmgr;
    s->error = mmgr->error;
    s->type = HPDF_FONTDEF_TYPE_TRUETYPE;
    s->clean_fn = CleanFunc;
    s->free_fn = FreeFunc;
    s_00 = HPDF_GetMem(mmgr,0x1b0);
    if (s_00 != (void *)0x0) {
      s->attr = s_00;
      HPDF_MemSet(s_00,'\0',0x1b0);
      s->flags = 0x20;
      return s;
    }
    HPDF_FreeMem(s->mmgr,s);
  }
  return (HPDF_FontDef)0x0;
}

Assistant:

HPDF_FontDef
HPDF_TTFontDef_New (HPDF_MMgr   mmgr)
{
    HPDF_FontDef fontdef;
    HPDF_TTFontDefAttr fontdef_attr;

    HPDF_PTRACE ((" HPDF_TTFontDef_New\n"));

    if (!mmgr)
        return NULL;

    fontdef = HPDF_GetMem (mmgr, sizeof(HPDF_FontDef_Rec));
    if (!fontdef)
        return NULL;

    HPDF_MemSet (fontdef, 0, sizeof(HPDF_FontDef_Rec));
    fontdef->sig_bytes = HPDF_FONTDEF_SIG_BYTES;
    fontdef->mmgr = mmgr;
    fontdef->error = mmgr->error;
    fontdef->type = HPDF_FONTDEF_TYPE_TRUETYPE;
    fontdef->clean_fn = CleanFunc;
    fontdef->free_fn = FreeFunc;

    fontdef_attr = HPDF_GetMem (mmgr, sizeof(HPDF_TTFontDefAttr_Rec));
    if (!fontdef_attr) {
        HPDF_FreeMem (fontdef->mmgr, fontdef);
        return NULL;
    }

    fontdef->attr = fontdef_attr;
    HPDF_MemSet ((HPDF_BYTE *)fontdef_attr, 0, sizeof(HPDF_TTFontDefAttr_Rec));
    fontdef->flags = HPDF_FONT_STD_CHARSET;

    return fontdef;
}